

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O0

void __thiscall
SemanticAnalyserTest_CallArgumentTypeMismatchThrows2_Test::
~SemanticAnalyserTest_CallArgumentTypeMismatchThrows2_Test
          (SemanticAnalyserTest_CallArgumentTypeMismatchThrows2_Test *this)

{
  void *in_RDI;
  
  ~SemanticAnalyserTest_CallArgumentTypeMismatchThrows2_Test
            ((SemanticAnalyserTest_CallArgumentTypeMismatchThrows2_Test *)0x1e9098);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, CallArgumentTypeMismatchThrows2)
{
  std::string source = R"SRC(
  fn addOne(x: f32): f32
  {
    ret x+1;
  }

  fn main(): f32
  {
    addOne(\(x:f32):f32 = { ret x; });
    ret 0;
  }
  )SRC";
  throwTest(source);
}